

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void __thiscall
BaseIndex::BlockConnected
          (BaseIndex *this,ChainstateRole role,shared_ptr<const_CBlock> *block,CBlockIndex *pindex)

{
  CBlockIndex *this_00;
  string_view source_file;
  bool bVar1;
  int iVar2;
  CBlockIndex *pCVar3;
  Logger *pLVar4;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view str;
  BlockInfo block_info;
  base_blob<256u> local_128 [32];
  string local_108;
  base_blob<256u> local_e8 [32];
  string local_c8 [3];
  base_blob<256u> local_68 [32];
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((role != ASSUMEDVALID) && (((this->m_synced)._M_base._M_i & 1U) != 0)) {
    this_00 = (this->m_best_block_index)._M_b._M_p;
    if (this_00 == (CBlockIndex *)0x0) {
      if (pindex->nHeight != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          FatalErrorf<char[15],int>
                    (this,"%s: First block connected is not the genesis block (height=%d)",
                     (char (*) [15])"BlockConnected",&pindex->nHeight);
          return;
        }
        goto LAB_003d82f8;
      }
LAB_003d806e:
      kernel::MakeBlockInfo
                (&block_info,pindex,
                 (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      iVar2 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xc])
                        (this,&block_info);
      if ((char)iVar2 != '\0') {
        SetBestBlockIndex(this,pindex);
        goto LAB_003d80ea;
      }
      CBlockIndex::GetBlockHash((uint256 *)local_68,pindex);
      base_blob<256u>::ToString_abi_cxx11_(&local_48,local_68);
      FatalErrorf<char[15],std::__cxx11::string>
                (this,"%s: Failed to write block %s to index",(char (*) [15])"BlockConnected",
                 &local_48);
      this_01 = &local_48;
    }
    else {
      pCVar3 = CBlockIndex::GetAncestor(this_00,pindex->nHeight + -1);
      if (pCVar3 == pindex->pprev) {
        if (pCVar3 != this_00) {
          bVar1 = Rewind(this,this_00,pindex->pprev);
          if (!bVar1) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              FatalErrorf<char[15],std::__cxx11::string>
                        (this,"%s: Failed to rewind index %s to a previous chain tip",
                         (char (*) [15])"BlockConnected",&this->m_name);
              return;
            }
            goto LAB_003d82f8;
          }
        }
        goto LAB_003d806e;
      }
      CBlockIndex::GetBlockHash((uint256 *)local_e8,pindex);
      base_blob<256u>::ToString_abi_cxx11_(local_c8,local_e8);
      CBlockIndex::GetBlockHash((uint256 *)local_128,this_00);
      base_blob<256u>::ToString_abi_cxx11_(&local_108,local_128);
      pLVar4 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar4);
      if (bVar1) {
        block_info.hash = (uint256 *)&block_info.height;
        block_info.prev_hash = (uint256 *)0x0;
        block_info.height._0_1_ = 0;
        tinyformat::format<char[15],std::__cxx11::string,std::__cxx11::string>
                  (&local_48,
                   (tinyformat *)
                   "%s: WARNING: Block %s does not connect to an ancestor of known best chain (tip=%s); not updating index\n"
                   ,"BlockConnected",(char (*) [15])local_c8,&local_108,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&block_info,
                   &local_48);
        std::__cxx11::string::~string((string *)&local_48);
        pLVar4 = LogInstance();
        local_48._M_dataplus._M_p = (pointer)0x57;
        local_48._M_string_length = 0x6e2bb7;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
        ;
        source_file._M_len = 0x57;
        logging_function._M_str = "BlockConnected";
        logging_function._M_len = 0xe;
        str._M_str = (char *)block_info.hash;
        str._M_len = (size_t)block_info.prev_hash;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x130,ALL,Info);
        std::__cxx11::string::~string((string *)&block_info);
      }
      std::__cxx11::string::~string((string *)&local_108);
      this_01 = local_c8;
    }
    std::__cxx11::string::~string((string *)this_01);
  }
LAB_003d80ea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_003d82f8:
  __stack_chk_fail();
}

Assistant:

void BaseIndex::BlockConnected(ChainstateRole role, const std::shared_ptr<const CBlock>& block, const CBlockIndex* pindex)
{
    // Ignore events from the assumed-valid chain; we will process its blocks
    // (sequentially) after it is fully verified by the background chainstate. This
    // is to avoid any out-of-order indexing.
    //
    // TODO at some point we could parameterize whether a particular index can be
    // built out of order, but for now just do the conservative simple thing.
    if (role == ChainstateRole::ASSUMEDVALID) {
        return;
    }

    // Ignore BlockConnected signals until we have fully indexed the chain.
    if (!m_synced) {
        return;
    }

    const CBlockIndex* best_block_index = m_best_block_index.load();
    if (!best_block_index) {
        if (pindex->nHeight != 0) {
            FatalErrorf("%s: First block connected is not the genesis block (height=%d)",
                       __func__, pindex->nHeight);
            return;
        }
    } else {
        // Ensure block connects to an ancestor of the current best block. This should be the case
        // most of the time, but may not be immediately after the sync thread catches up and sets
        // m_synced. Consider the case where there is a reorg and the blocks on the stale branch are
        // in the ValidationInterface queue backlog even after the sync thread has caught up to the
        // new chain tip. In this unlikely event, log a warning and let the queue clear.
        if (best_block_index->GetAncestor(pindex->nHeight - 1) != pindex->pprev) {
            LogPrintf("%s: WARNING: Block %s does not connect to an ancestor of "
                      "known best chain (tip=%s); not updating index\n",
                      __func__, pindex->GetBlockHash().ToString(),
                      best_block_index->GetBlockHash().ToString());
            return;
        }
        if (best_block_index != pindex->pprev && !Rewind(best_block_index, pindex->pprev)) {
            FatalErrorf("%s: Failed to rewind index %s to a previous chain tip",
                       __func__, GetName());
            return;
        }
    }
    interfaces::BlockInfo block_info = kernel::MakeBlockInfo(pindex, block.get());
    if (CustomAppend(block_info)) {
        // Setting the best block index is intentionally the last step of this
        // function, so BlockUntilSyncedToCurrentChain callers waiting for the
        // best block index to be updated can rely on the block being fully
        // processed, and the index object being safe to delete.
        SetBestBlockIndex(pindex);
    } else {
        FatalErrorf("%s: Failed to write block %s to index",
                   __func__, pindex->GetBlockHash().ToString());
        return;
    }
}